

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O1

vector<int_*,_std::allocator<int_*>_> * __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::queryRectangle(vector<int_*,_std::allocator<int_*>_> *__return_storage_ptr__,
                KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                *this,int *searchMin,int *searchMax)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  if (*searchMin <= *searchMax) {
    uVar4 = 0xffffffffffffffff;
    do {
      if (uVar4 == 3) goto LAB_0010278e;
      lVar2 = uVar4 + 2;
      uVar1 = uVar4 + 1;
      lVar3 = uVar4 + 2;
      uVar4 = uVar1;
    } while (searchMin[lVar3] <= searchMax[lVar2]);
    (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (uVar1 < 4) {
      return __return_storage_ptr__;
    }
LAB_0010278e:
    if (this->root != (Node *)0x0) {
      queryRectangle(__return_storage_ptr__,this,this->root,searchMin,searchMax,this->boundingBoxMin
                     ,this->boundingBoxMax,0);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> queryRectangle(T* searchMin, T* searchMax) {
			for (int d = 0; d < dim; d++) {
				if (LESS()(searchMax, searchMin, d)) {
					return std::vector<T*>();
				}
			}

			if (root == nullptr) {
				return std::vector<T*>();
			}

			const int zeroDepth = 0;
			return queryRectangle(root, searchMin, searchMax, boundingBoxMin, boundingBoxMax, zeroDepth);
		}